

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

bool __thiscall flatbuffers::cpp::CppGenerator::generate_bfbs_embed(CppGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  Namespace *name_space;
  string *psVar1;
  bool bVar2;
  SizeT SVar3;
  char *pcVar4;
  uint8_t *buffer;
  undefined1 local_678 [8];
  string final_code;
  undefined1 local_638 [8];
  string file_path;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  undefined1 local_248 [8];
  string binary_schema_hex_text;
  string local_220;
  undefined1 local_200 [8];
  string name;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string include_guard;
  StructDef *struct_def;
  string local_a8;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  CppGenerator *local_10;
  CppGenerator *this_local;
  
  local_10 = this;
  CodeWriter::Clear(&this->code_);
  pcVar4 = BaseGenerator::FlatBuffersGeneratedWarning();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar4,&local_71);
  std::operator+(&local_50,"// ",&local_70);
  std::operator+(&local_30,&local_50,"\n\n");
  CodeWriter::operator+=(&this->code_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ == (StructDef *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"// Binary schema not generated, no root struct found",
               (allocator<char> *)((long)&struct_def + 7));
    CodeWriter::operator+=(&this->code_,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&struct_def + 7));
  }
  else {
    include_guard.field_2._8_8_ = ((this->super_BaseGenerator).parser_)->root_struct_def_;
    psVar1 = (this->super_BaseGenerator).file_name_;
    name_space = (((StructDef *)include_guard.field_2._8_8_)->super_Definition).defined_namespace;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"bfbs",&local_f9);
    GenIncludeGuard((string *)local_d8,psVar1,name_space,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::operator+(&local_120,"#ifndef ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    CodeWriter::operator+=(&this->code_,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::operator+(&local_140,"#define ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    CodeWriter::operator+=(&this->code_,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
    CodeWriter::operator+=(&this->code_,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    if (((((this->super_BaseGenerator).parser_)->opts).gen_nullable & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"#pragma clang system_header\n\n",&local_189);
      CodeWriter::operator+=(&this->code_,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"#include <cstddef>",&local_1b1);
    CodeWriter::operator+=(&this->code_,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"#include <cstdint>",
               (allocator<char> *)(name.field_2._M_local_buf + 0xf));
    CodeWriter::operator+=(&this->code_,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    SetNameSpace(this,*(Namespace **)(include_guard.field_2._8_8_ + 0xa8));
    Name_abi_cxx11_((string *)local_200,this,(Definition *)include_guard.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"STRUCT_NAME",
               (allocator<char> *)(binary_schema_hex_text.field_2._M_local_buf + 0xf));
    CodeWriter::SetValue(&this->code_,&local_220,(string *)local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator
              ((allocator<char> *)(binary_schema_hex_text.field_2._M_local_buf + 0xf));
    buffer = FlatBufferBuilderImpl<false>::GetBufferPointer
                       (&((this->super_BaseGenerator).parser_)->builder_);
    SVar3 = FlatBufferBuilderImpl<false>::GetSize(&((this->super_BaseGenerator).parser_)->builder_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"      ",&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    BufferToHexText((string *)local_248,buffer,(ulong)SVar3,0x69,&local_268,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"struct {{STRUCT_NAME}}BinarySchema {",&local_2b9);
    CodeWriter::operator+=(&this->code_,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"  static const uint8_t *data() {",&local_2e1);
    CodeWriter::operator+=(&this->code_,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"    // Buffer containing the binary schema.",&local_309);
    CodeWriter::operator+=(&this->code_,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    SVar3 = FlatBufferBuilderImpl<false>::GetSize(&((this->super_BaseGenerator).parser_)->builder_);
    NumToString<unsigned_int>(&local_370,SVar3);
    std::operator+(&local_350,"    static const uint8_t bfbsData[",&local_370);
    std::operator+(&local_330,&local_350,"] = {");
    CodeWriter::operator+=(&this->code_,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::string((string *)&local_390,(string *)local_248);
    CodeWriter::operator+=(&this->code_,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"    };",&local_3b1);
    CodeWriter::operator+=(&this->code_,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"    return bfbsData;",&local_3d9);
    CodeWriter::operator+=(&this->code_,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"  }",&local_401);
    CodeWriter::operator+=(&this->code_,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"  static size_t size() {",&local_429);
    CodeWriter::operator+=(&this->code_,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    SVar3 = FlatBufferBuilderImpl<false>::GetSize(&((this->super_BaseGenerator).parser_)->builder_);
    NumToString<unsigned_int>(&local_490,SVar3);
    std::operator+(&local_470,"    return ",&local_490);
    std::operator+(&local_450,&local_470,";");
    CodeWriter::operator+=(&this->code_,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"  }",&local_4b1);
    CodeWriter::operator+=(&this->code_,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"  const uint8_t *begin() {",&local_4d9);
    CodeWriter::operator+=(&this->code_,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_500,"    return data();",&local_501);
    CodeWriter::operator+=(&this->code_,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator(&local_501);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"  }",&local_529);
    CodeWriter::operator+=(&this->code_,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator(&local_529);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_550,"  const uint8_t *end() {",&local_551);
    CodeWriter::operator+=(&this->code_,&local_550);
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator(&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_578,"    return data() + size();",&local_579);
    CodeWriter::operator+=(&this->code_,&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator(&local_579);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"  }",&local_5a1);
    CodeWriter::operator+=(&this->code_,&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"};",&local_5c9);
    CodeWriter::operator+=(&this->code_,&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"",&local_5f1);
    CodeWriter::operator+=(&this->code_,&local_5f0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
    if (this->cur_name_space_ != (Namespace *)0x0) {
      SetNameSpace(this,(Namespace *)0x0);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file_path.field_2 + 8),"#endif  // ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    CodeWriter::operator+=(&this->code_,(string *)((long)&file_path.field_2 + 8));
    std::__cxx11::string::~string((string *)(file_path.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::~string((string *)local_d8);
  }
  psVar1 = (this->super_BaseGenerator).path_;
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&final_code.field_2 + 8);
  std::operator+(__return_storage_ptr__,(this->super_BaseGenerator).file_name_,"_bfbs");
  BaseGenerator::GeneratedFileName
            ((string *)local_638,&this->super_BaseGenerator,psVar1,__return_storage_ptr__,
             &(this->opts_).super_IDLOptions);
  std::__cxx11::string::~string((string *)(final_code.field_2._M_local_buf + 8));
  CodeWriter::ToString_abi_cxx11_((string *)local_678,&this->code_);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar2 = SaveFile(pcVar4,(string *)local_678,false);
  std::__cxx11::string::~string((string *)local_678);
  std::__cxx11::string::~string((string *)local_638);
  return bVar2;
}

Assistant:

bool generate_bfbs_embed() {
    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";

    // If we don't have a root struct definition,
    if (!parser_.root_struct_def_) {
      // put a comment in the output why there is no code generated.
      code_ += "// Binary schema not generated, no root struct found";
    } else {
      auto &struct_def = *parser_.root_struct_def_;
      const auto include_guard =
          GenIncludeGuard(file_name_, *struct_def.defined_namespace, "bfbs");

      code_ += "#ifndef " + include_guard;
      code_ += "#define " + include_guard;
      code_ += "";
      if (parser_.opts.gen_nullable) {
        code_ += "#pragma clang system_header\n\n";
      }

      code_ += "#include <cstddef>";
      code_ += "#include <cstdint>";

      SetNameSpace(struct_def.defined_namespace);
      auto name = Name(struct_def);
      code_.SetValue("STRUCT_NAME", name);

      // Create code to return the binary schema data.
      auto binary_schema_hex_text =
          BufferToHexText(parser_.builder_.GetBufferPointer(),
                          parser_.builder_.GetSize(), 105, "      ", "");

      code_ += "struct {{STRUCT_NAME}}BinarySchema {";
      code_ += "  static const uint8_t *data() {";
      code_ += "    // Buffer containing the binary schema.";
      code_ += "    static const uint8_t bfbsData[" +
               NumToString(parser_.builder_.GetSize()) + "] = {";
      code_ += binary_schema_hex_text;
      code_ += "    };";
      code_ += "    return bfbsData;";
      code_ += "  }";
      code_ += "  static size_t size() {";
      code_ += "    return " + NumToString(parser_.builder_.GetSize()) + ";";
      code_ += "  }";
      code_ += "  const uint8_t *begin() {";
      code_ += "    return data();";
      code_ += "  }";
      code_ += "  const uint8_t *end() {";
      code_ += "    return data() + size();";
      code_ += "  }";
      code_ += "};";
      code_ += "";

      if (cur_name_space_) SetNameSpace(nullptr);

      // Close the include guard.
      code_ += "#endif  // " + include_guard;
    }

    // We are just adding "_bfbs" to the generated filename.
    const auto file_path =
        GeneratedFileName(path_, file_name_ + "_bfbs", opts_);
    const auto final_code = code_.ToString();

    return SaveFile(file_path.c_str(), final_code, false);
  }